

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnoncontiguousbytedevice.cpp
# Opt level: O0

void __thiscall
QNonContiguousByteDeviceIoDeviceImpl::QNonContiguousByteDeviceIoDeviceImpl
          (QNonContiguousByteDeviceIoDeviceImpl *this,QIODevice *d)

{
  long lVar1;
  undefined8 uVar2;
  long *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QNonContiguousByteDevice *in_stack_ffffffffffffff60;
  offset_in_QNonContiguousByteDevice_to_subr *slot;
  ContextType *in_stack_ffffffffffffffa8;
  Object *in_stack_ffffffffffffffb0;
  offset_in_QIODevice_to_subr in_stack_ffffffffffffffd0;
  ConnectionType in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QNonContiguousByteDevice::QNonContiguousByteDevice(in_stack_ffffffffffffff60);
  *in_RDI = &PTR_metaObject_00be3398;
  in_RDI[2] = in_RSI;
  in_RDI[3] = 0;
  in_RDI[4] = 0x4000;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  *(undefined1 *)(in_RDI + 8) = 0;
  uVar2 = (**(code **)(*in_RSI + 0x78))();
  in_RDI[9] = uVar2;
  slot = (offset_in_QNonContiguousByteDevice_to_subr *)0x0;
  QObject::connect<void(QIODevice::*)(),void(QNonContiguousByteDevice::*)()>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffa8,
             (offset_in_QNonContiguousByteDevice_to_subr *)0x0,in_stack_fffffffffffffff0);
  QMetaObject::Connection::~Connection((Connection *)in_stack_ffffffffffffff60);
  QObject::connect<void(QIODevice::*)(),void(QNonContiguousByteDevice::*)()>
            (in_stack_ffffffffffffffb0,0,in_stack_ffffffffffffffa8,slot,in_stack_fffffffffffffff0);
  QMetaObject::Connection::~Connection((Connection *)in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNonContiguousByteDeviceIoDeviceImpl::QNonContiguousByteDeviceIoDeviceImpl(QIODevice *d)
    : QNonContiguousByteDevice(),
      device(d),
      currentReadBuffer(nullptr),
      currentReadBufferSize(16 * 1024),
      currentReadBufferAmount(0),
      currentReadBufferPosition(0),
      totalAdvancements(0),
      eof(false),
      initialPosition(d->pos())
{
    connect(device, &QIODevice::readyRead, this,
            &QNonContiguousByteDevice::readyRead);
    connect(device, &QIODevice::readChannelFinished, this,
            &QNonContiguousByteDevice::readyRead);
}